

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_transcoder.cpp
# Opt level: O0

bool __thiscall
basist::basisu_lowlevel_uastc_transcoder::transcode_image
          (basisu_lowlevel_uastc_transcoder *this,transcoder_texture_format target_format,
          void *pOutput_blocks,uint32_t output_blocks_buf_size_in_blocks_or_pixels,
          uint8_t *pCompressed_data,uint32_t compressed_data_length,uint32_t num_blocks_x,
          uint32_t num_blocks_y,uint32_t orig_width,uint32_t orig_height,uint32_t level_index,
          uint32_t slice_offset,uint32_t slice_length,uint32_t decode_flags,bool has_alpha,
          bool is_video,uint32_t output_row_pitch_in_blocks_or_pixels,
          basisu_transcoder_state *pState,uint32_t output_rows_in_pixels,int channel0,int channel1)

{
  bool bVar1;
  int in_ESI;
  uint in_R9D;
  int in_stack_00000008;
  int in_stack_00000010;
  uint in_stack_00000030;
  uint in_stack_00000038;
  byte in_stack_00000048;
  undefined4 in_stack_00000058;
  uint32_t in_stack_0000005c;
  uint8_t *in_stack_00000060;
  uint32_t in_stack_00000068;
  uint32_t in_stack_0000006c;
  undefined4 in_stack_00000070;
  undefined4 in_stack_00000074;
  undefined4 in_stack_00000078;
  undefined4 in_stack_0000007c;
  block_format in_stack_00000090;
  uint32_t in_stack_00000098;
  uint32_t in_stack_000000b0;
  uint32_t in_stack_000000b8;
  uint32_t in_stack_000000c0;
  basisu_transcoder_state *in_stack_000000c8;
  uint32_t in_stack_000000d0;
  int in_stack_000000d8;
  int in_stack_000000e0;
  uint32_t in_stack_000000e8;
  bool status;
  uint32_t total_slice_blocks;
  uint32_t bytes_per_block_or_pixel;
  bool transcode_alpha_data_to_opaque_formats;
  uint32_t in_stack_fffffffffffffe6c;
  transcoder_texture_format in_stack_fffffffffffffe70;
  uint32_t in_stack_fffffffffffffe74;
  uint32_t in_stack_fffffffffffffe78;
  uint32_t in_stack_fffffffffffffe7c;
  transcoder_texture_format in_stack_fffffffffffffe80;
  uint32_t in_stack_fffffffffffffe90;
  bool local_71;
  int local_44;
  
  if ((ulong)in_R9D < (ulong)in_stack_00000030 + (ulong)in_stack_00000038) {
    return false;
  }
  if (((in_ESI == 8) || (in_ESI == 9)) &&
     ((bVar1 = basisu::is_pow2(in_stack_00000008 << 2), !bVar1 ||
      (bVar1 = basisu::is_pow2(in_stack_00000010 << 2), !bVar1)))) {
    return false;
  }
  local_44 = in_ESI;
  if ((in_ESI == 9) && ((in_stack_00000048 & 1) == 0)) {
    local_44 = 8;
  }
  basis_get_bytes_per_block_or_pixel(in_stack_fffffffffffffe70);
  bVar1 = basis_validate_output_buffer_size
                    (in_stack_fffffffffffffe80,in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78,
                     in_stack_fffffffffffffe74,in_stack_fffffffffffffe70,in_stack_fffffffffffffe6c,
                     in_stack_fffffffffffffe90);
  if (bVar1) {
    switch(local_44) {
    case 0:
      local_71 = transcode_slice((basisu_lowlevel_uastc_transcoder *)
                                 CONCAT44(in_stack_0000007c,in_stack_00000078),
                                 (void *)CONCAT44(in_stack_00000074,in_stack_00000070),
                                 in_stack_0000006c,in_stack_00000068,in_stack_00000060,
                                 in_stack_0000005c,in_stack_00000090,in_stack_00000098,
                                 in_stack_00000058._3_1_,in_stack_00000058._2_1_,in_stack_000000b0,
                                 in_stack_000000b8,in_stack_000000c0,in_stack_000000c8,
                                 in_stack_000000d0,in_stack_000000d8,in_stack_000000e0,
                                 in_stack_000000e8);
      break;
    case 1:
      local_71 = transcode_slice((basisu_lowlevel_uastc_transcoder *)
                                 CONCAT44(in_stack_0000007c,in_stack_00000078),
                                 (void *)CONCAT44(in_stack_00000074,in_stack_00000070),
                                 in_stack_0000006c,in_stack_00000068,in_stack_00000060,
                                 in_stack_0000005c,in_stack_00000090,in_stack_00000098,
                                 in_stack_00000058._3_1_,in_stack_00000058._2_1_,in_stack_000000b0,
                                 in_stack_000000b8,in_stack_000000c0,in_stack_000000c8,
                                 in_stack_000000d0,in_stack_000000d8,in_stack_000000e0,
                                 in_stack_000000e8);
      break;
    case 2:
      local_71 = transcode_slice((basisu_lowlevel_uastc_transcoder *)
                                 CONCAT44(in_stack_0000007c,in_stack_00000078),
                                 (void *)CONCAT44(in_stack_00000074,in_stack_00000070),
                                 in_stack_0000006c,in_stack_00000068,in_stack_00000060,
                                 in_stack_0000005c,in_stack_00000090,in_stack_00000098,
                                 in_stack_00000058._3_1_,in_stack_00000058._2_1_,in_stack_000000b0,
                                 in_stack_000000b8,in_stack_000000c0,in_stack_000000c8,
                                 in_stack_000000d0,in_stack_000000d8,in_stack_000000e0,
                                 in_stack_000000e8);
      break;
    case 3:
      local_71 = transcode_slice((basisu_lowlevel_uastc_transcoder *)
                                 CONCAT44(in_stack_0000007c,in_stack_00000078),
                                 (void *)CONCAT44(in_stack_00000074,in_stack_00000070),
                                 in_stack_0000006c,in_stack_00000068,in_stack_00000060,
                                 in_stack_0000005c,in_stack_00000090,in_stack_00000098,
                                 in_stack_00000058._3_1_,in_stack_00000058._2_1_,in_stack_000000b0,
                                 in_stack_000000b8,in_stack_000000c0,in_stack_000000c8,
                                 in_stack_000000d0,in_stack_000000d8,in_stack_000000e0,
                                 in_stack_000000e8);
      break;
    case 4:
      local_71 = transcode_slice((basisu_lowlevel_uastc_transcoder *)
                                 CONCAT44(in_stack_0000007c,in_stack_00000078),
                                 (void *)CONCAT44(in_stack_00000074,in_stack_00000070),
                                 in_stack_0000006c,in_stack_00000068,in_stack_00000060,
                                 in_stack_0000005c,in_stack_00000090,in_stack_00000098,
                                 in_stack_00000058._3_1_,in_stack_00000058._2_1_,in_stack_000000b0,
                                 in_stack_000000b8,in_stack_000000c0,in_stack_000000c8,
                                 in_stack_000000d0,in_stack_000000d8,in_stack_000000e0,
                                 in_stack_000000e8);
      break;
    case 5:
      local_71 = transcode_slice((basisu_lowlevel_uastc_transcoder *)
                                 CONCAT44(in_stack_0000007c,in_stack_00000078),
                                 (void *)CONCAT44(in_stack_00000074,in_stack_00000070),
                                 in_stack_0000006c,in_stack_00000068,in_stack_00000060,
                                 in_stack_0000005c,in_stack_00000090,in_stack_00000098,
                                 in_stack_00000058._3_1_,in_stack_00000058._2_1_,in_stack_000000b0,
                                 in_stack_000000b8,in_stack_000000c0,in_stack_000000c8,
                                 in_stack_000000d0,in_stack_000000d8,in_stack_000000e0,
                                 in_stack_000000e8);
      break;
    case 6:
    case 7:
      local_71 = transcode_slice((basisu_lowlevel_uastc_transcoder *)
                                 CONCAT44(in_stack_0000007c,in_stack_00000078),
                                 (void *)CONCAT44(in_stack_00000074,in_stack_00000070),
                                 in_stack_0000006c,in_stack_00000068,in_stack_00000060,
                                 in_stack_0000005c,in_stack_00000090,in_stack_00000098,
                                 in_stack_00000058._3_1_,in_stack_00000058._2_1_,in_stack_000000b0,
                                 in_stack_000000b8,in_stack_000000c0,in_stack_000000c8,
                                 in_stack_000000d0,in_stack_000000d8,in_stack_000000e0,
                                 in_stack_000000e8);
      break;
    case 8:
      local_71 = transcode_slice((basisu_lowlevel_uastc_transcoder *)
                                 CONCAT44(in_stack_0000007c,in_stack_00000078),
                                 (void *)CONCAT44(in_stack_00000074,in_stack_00000070),
                                 in_stack_0000006c,in_stack_00000068,in_stack_00000060,
                                 in_stack_0000005c,in_stack_00000090,in_stack_00000098,
                                 in_stack_00000058._3_1_,in_stack_00000058._2_1_,in_stack_000000b0,
                                 in_stack_000000b8,in_stack_000000c0,in_stack_000000c8,
                                 in_stack_000000d0,in_stack_000000d8,in_stack_000000e0,
                                 in_stack_000000e8);
      break;
    case 9:
      local_71 = transcode_slice((basisu_lowlevel_uastc_transcoder *)
                                 CONCAT44(in_stack_0000007c,in_stack_00000078),
                                 (void *)CONCAT44(in_stack_00000074,in_stack_00000070),
                                 in_stack_0000006c,in_stack_00000068,in_stack_00000060,
                                 in_stack_0000005c,in_stack_00000090,in_stack_00000098,
                                 in_stack_00000058._3_1_,in_stack_00000058._2_1_,in_stack_000000b0,
                                 in_stack_000000b8,in_stack_000000c0,in_stack_000000c8,
                                 in_stack_000000d0,in_stack_000000d8,in_stack_000000e0,
                                 in_stack_000000e8);
      break;
    case 10:
      local_71 = transcode_slice((basisu_lowlevel_uastc_transcoder *)
                                 CONCAT44(in_stack_0000007c,in_stack_00000078),
                                 (void *)CONCAT44(in_stack_00000074,in_stack_00000070),
                                 in_stack_0000006c,in_stack_00000068,in_stack_00000060,
                                 in_stack_0000005c,in_stack_00000090,in_stack_00000098,
                                 in_stack_00000058._3_1_,in_stack_00000058._2_1_,in_stack_000000b0,
                                 in_stack_000000b8,in_stack_000000c0,in_stack_000000c8,
                                 in_stack_000000d0,in_stack_000000d8,in_stack_000000e0,
                                 in_stack_000000e8);
      break;
    case 0xb:
    case 0xc:
      return false;
    case 0xd:
      local_71 = transcode_slice((basisu_lowlevel_uastc_transcoder *)
                                 CONCAT44(in_stack_0000007c,in_stack_00000078),
                                 (void *)CONCAT44(in_stack_00000074,in_stack_00000070),
                                 in_stack_0000006c,in_stack_00000068,in_stack_00000060,
                                 in_stack_0000005c,in_stack_00000090,in_stack_00000098,
                                 in_stack_00000058._3_1_,in_stack_00000058._2_1_,in_stack_000000b0,
                                 in_stack_000000b8,in_stack_000000c0,in_stack_000000c8,
                                 in_stack_000000d0,in_stack_000000d8,in_stack_000000e0,
                                 in_stack_000000e8);
      break;
    case 0xe:
      local_71 = transcode_slice((basisu_lowlevel_uastc_transcoder *)
                                 CONCAT44(in_stack_0000007c,in_stack_00000078),
                                 (void *)CONCAT44(in_stack_00000074,in_stack_00000070),
                                 in_stack_0000006c,in_stack_00000068,in_stack_00000060,
                                 in_stack_0000005c,in_stack_00000090,in_stack_00000098,
                                 in_stack_00000058._3_1_,in_stack_00000058._2_1_,in_stack_000000b0,
                                 in_stack_000000b8,in_stack_000000c0,in_stack_000000c8,
                                 in_stack_000000d0,in_stack_000000d8,in_stack_000000e0,
                                 in_stack_000000e8);
      break;
    case 0xf:
      local_71 = transcode_slice((basisu_lowlevel_uastc_transcoder *)
                                 CONCAT44(in_stack_0000007c,in_stack_00000078),
                                 (void *)CONCAT44(in_stack_00000074,in_stack_00000070),
                                 in_stack_0000006c,in_stack_00000068,in_stack_00000060,
                                 in_stack_0000005c,in_stack_00000090,in_stack_00000098,
                                 in_stack_00000058._3_1_,in_stack_00000058._2_1_,in_stack_000000b0,
                                 in_stack_000000b8,in_stack_000000c0,in_stack_000000c8,
                                 in_stack_000000d0,in_stack_000000d8,in_stack_000000e0,
                                 in_stack_000000e8);
      break;
    case 0x10:
      local_71 = transcode_slice((basisu_lowlevel_uastc_transcoder *)
                                 CONCAT44(in_stack_0000007c,in_stack_00000078),
                                 (void *)CONCAT44(in_stack_00000074,in_stack_00000070),
                                 in_stack_0000006c,in_stack_00000068,in_stack_00000060,
                                 in_stack_0000005c,in_stack_00000090,in_stack_00000098,
                                 in_stack_00000058._3_1_,in_stack_00000058._2_1_,in_stack_000000b0,
                                 in_stack_000000b8,in_stack_000000c0,in_stack_000000c8,
                                 in_stack_000000d0,in_stack_000000d8,in_stack_000000e0,
                                 in_stack_000000e8);
      break;
    case 0x11:
      return false;
    case 0x12:
      return false;
    case 0x13:
      return false;
    case 0x14:
      local_71 = transcode_slice((basisu_lowlevel_uastc_transcoder *)
                                 CONCAT44(in_stack_0000007c,in_stack_00000078),
                                 (void *)CONCAT44(in_stack_00000074,in_stack_00000070),
                                 in_stack_0000006c,in_stack_00000068,in_stack_00000060,
                                 in_stack_0000005c,in_stack_00000090,in_stack_00000098,
                                 in_stack_00000058._3_1_,in_stack_00000058._2_1_,in_stack_000000b0,
                                 in_stack_000000b8,in_stack_000000c0,in_stack_000000c8,
                                 in_stack_000000d0,in_stack_000000d8,in_stack_000000e0,
                                 in_stack_000000e8);
      break;
    case 0x15:
      local_71 = transcode_slice((basisu_lowlevel_uastc_transcoder *)
                                 CONCAT44(in_stack_0000007c,in_stack_00000078),
                                 (void *)CONCAT44(in_stack_00000074,in_stack_00000070),
                                 in_stack_0000006c,in_stack_00000068,in_stack_00000060,
                                 in_stack_0000005c,in_stack_00000090,in_stack_00000098,
                                 in_stack_00000058._3_1_,in_stack_00000058._2_1_,in_stack_000000b0,
                                 in_stack_000000b8,in_stack_000000c0,in_stack_000000c8,
                                 in_stack_000000d0,in_stack_000000d8,in_stack_000000e0,
                                 in_stack_000000e8);
      break;
    default:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/transcoder/basisu_transcoder.cpp"
                    ,0x2633,
                    "bool basist::basisu_lowlevel_uastc_transcoder::transcode_image(transcoder_texture_format, void *, uint32_t, const uint8_t *, uint32_t, uint32_t, uint32_t, uint32_t, uint32_t, uint32_t, uint32_t, uint32_t, uint32_t, bool, bool, uint32_t, basisu_transcoder_state *, uint32_t, int, int)"
                   );
    }
    return local_71;
  }
  return false;
}

Assistant:

bool basisu_lowlevel_uastc_transcoder::transcode_image(
		transcoder_texture_format target_format,
		void* pOutput_blocks, uint32_t output_blocks_buf_size_in_blocks_or_pixels,
		const uint8_t* pCompressed_data, uint32_t compressed_data_length,
		uint32_t num_blocks_x, uint32_t num_blocks_y, uint32_t orig_width, uint32_t orig_height, uint32_t level_index,
		uint32_t slice_offset, uint32_t slice_length,
		uint32_t decode_flags,
		bool has_alpha,
		bool is_video,
		uint32_t output_row_pitch_in_blocks_or_pixels,
		basisu_transcoder_state* pState,
		uint32_t output_rows_in_pixels,
		int channel0, int channel1)
	{
		BASISU_NOTE_UNUSED(is_video);
		BASISU_NOTE_UNUSED(level_index);

		if (((uint64_t)slice_offset + slice_length) > (uint64_t)compressed_data_length)
		{
			BASISU_DEVEL_ERROR("basisu_lowlevel_uastc_transcoder::transcode_image: source data buffer too small\n");
			return false;
		}	

		if ((target_format == transcoder_texture_format::cTFPVRTC1_4_RGB) || (target_format == transcoder_texture_format::cTFPVRTC1_4_RGBA))
		{
			if ((!basisu::is_pow2(num_blocks_x * 4)) || (!basisu::is_pow2(num_blocks_y * 4)))
			{
				// PVRTC1 only supports power of 2 dimensions
				BASISU_DEVEL_ERROR("basisu_lowlevel_uastc_transcoder::transcode_image: PVRTC1 only supports power of 2 dimensions\n");
				return false;
			}
		}

		if ((target_format == transcoder_texture_format::cTFPVRTC1_4_RGBA) && (!has_alpha))
		{
			// Switch to PVRTC1 RGB if the input doesn't have alpha.
			target_format = transcoder_texture_format::cTFPVRTC1_4_RGB;
		}

		const bool transcode_alpha_data_to_opaque_formats = (decode_flags & cDecodeFlagsTranscodeAlphaDataToOpaqueFormats) != 0;
		const uint32_t bytes_per_block_or_pixel = basis_get_bytes_per_block_or_pixel(target_format);
		const uint32_t total_slice_blocks = num_blocks_x * num_blocks_y;

		if (!basis_validate_output_buffer_size(target_format, output_blocks_buf_size_in_blocks_or_pixels, orig_width, orig_height, output_row_pitch_in_blocks_or_pixels, output_rows_in_pixels, total_slice_blocks))
		{
			BASISU_DEVEL_ERROR("basisu_lowlevel_uastc_transcoder::transcode_image: output buffer size too small\n");
			return false;
		}
				
		bool status = false;

		// UASTC4x4
		switch (target_format)
		{
		case transcoder_texture_format::cTFETC1_RGB:
		{
			//status = transcode_slice(pData, data_size, slice_index, pOutput_blocks, output_blocks_buf_size_in_blocks_or_pixels, block_format::cETC1, bytes_per_block_or_pixel, decode_flags, output_row_pitch_in_blocks_or_pixels, pState);
			status = transcode_slice(pOutput_blocks, num_blocks_x, num_blocks_y, pCompressed_data + slice_offset, slice_length, block_format::cETC1,
				bytes_per_block_or_pixel, false, has_alpha, orig_width, orig_height, output_row_pitch_in_blocks_or_pixels, pState, output_rows_in_pixels, channel0, channel1);
				
			if (!status)
			{
				BASISU_DEVEL_ERROR("basisu_lowlevel_uastc_transcoder::transcode_image: transcode_slice() to ETC1 failed\n");
			}
			break;
		}
		case transcoder_texture_format::cTFETC2_RGBA:
		{
			//status = transcode_slice(pData, data_size, slice_index, pOutput_blocks, output_blocks_buf_size_in_blocks_or_pixels, block_format::cETC2_RGBA, bytes_per_block_or_pixel, decode_flags, output_row_pitch_in_blocks_or_pixels, pState);
			status = transcode_slice(pOutput_blocks, num_blocks_x, num_blocks_y, pCompressed_data + slice_offset, slice_length, block_format::cETC2_RGBA,
				bytes_per_block_or_pixel, false, has_alpha, orig_width, orig_height, output_row_pitch_in_blocks_or_pixels, pState, output_rows_in_pixels, channel0, channel1);
			if (!status)
			{
				BASISU_DEVEL_ERROR("basisu_lowlevel_uastc_transcoder::transcode_image: transcode_slice() to ETC2 failed\n");
			}
			break;
		}
		case transcoder_texture_format::cTFBC1_RGB:
		{
			// TODO: ETC1S allows BC1 from alpha channel. That doesn't seem actually useful, though.
			//status = transcode_slice(pData, data_size, slice_index, pOutput_blocks, output_blocks_buf_size_in_blocks_or_pixels, block_format::cBC1, bytes_per_block_or_pixel, decode_flags, output_row_pitch_in_blocks_or_pixels, pState);
			status = transcode_slice(pOutput_blocks, num_blocks_x, num_blocks_y, pCompressed_data + slice_offset, slice_length, block_format::cBC1,
				bytes_per_block_or_pixel, true, has_alpha, orig_width, orig_height, output_row_pitch_in_blocks_or_pixels, pState, output_rows_in_pixels, channel0, channel1);
			if (!status)
			{
				BASISU_DEVEL_ERROR("basisu_lowlevel_uastc_transcoder::transcode_image: transcode_slice() to BC1 failed\n");
			}
			break;
		}
		case transcoder_texture_format::cTFBC3_RGBA:
		{
			//status = transcode_slice(pData, data_size, slice_index, pOutput_blocks, output_blocks_buf_size_in_blocks_or_pixels, block_format::cBC3, bytes_per_block_or_pixel, decode_flags, output_row_pitch_in_blocks_or_pixels, pState);
			status = transcode_slice(pOutput_blocks, num_blocks_x, num_blocks_y, pCompressed_data + slice_offset, slice_length, block_format::cBC3,
				bytes_per_block_or_pixel, false, has_alpha, orig_width, orig_height, output_row_pitch_in_blocks_or_pixels, pState, output_rows_in_pixels, channel0, channel1);
			if (!status)
			{
				BASISU_DEVEL_ERROR("basisu_lowlevel_uastc_transcoder::transcode_image: transcode_slice() to BC3 failed\n");
			}
			break;
		}
		case transcoder_texture_format::cTFBC4_R:
		{
			//status = transcode_slice(pData, data_size, slice_index, pOutput_blocks, output_blocks_buf_size_in_blocks_or_pixels, block_format::cBC4, bytes_per_block_or_pixel, decode_flags, output_row_pitch_in_blocks_or_pixels, pState,
			//	nullptr, 0,
			//	((has_alpha) && (transcode_alpha_data_to_opaque_formats)) ? 3 : 0);
			status = transcode_slice(pOutput_blocks, num_blocks_x, num_blocks_y, pCompressed_data + slice_offset, slice_length, block_format::cBC4,
				bytes_per_block_or_pixel, false, has_alpha, orig_width, orig_height, output_row_pitch_in_blocks_or_pixels, pState, output_rows_in_pixels,
				((has_alpha) && (transcode_alpha_data_to_opaque_formats)) ? 3 : 0);
			if (!status)
			{
				BASISU_DEVEL_ERROR("basisu_lowlevel_uastc_transcoder::transcode_image: transcode_slice() to BC4 failed\n");
			}
			break;
		}
		case transcoder_texture_format::cTFBC5_RG:
		{
			//status = transcode_slice(pData, data_size, slice_index, pOutput_blocks, output_blocks_buf_size_in_blocks_or_pixels, block_format::cBC5, bytes_per_block_or_pixel, decode_flags, output_row_pitch_in_blocks_or_pixels, pState,
			//	nullptr, 0,
			//	0, 3);
			status = transcode_slice(pOutput_blocks, num_blocks_x, num_blocks_y, pCompressed_data + slice_offset, slice_length, block_format::cBC5,
				bytes_per_block_or_pixel, false, has_alpha, orig_width, orig_height, output_row_pitch_in_blocks_or_pixels, pState, output_rows_in_pixels,
				0, 3);
			if (!status)
			{
				BASISU_DEVEL_ERROR("basisu_lowlevel_uastc_transcoder::transcode_image: transcode_slice() to BC5 failed\n");
			}
			break;
		}
		case transcoder_texture_format::cTFBC7_RGBA:
		case transcoder_texture_format::cTFBC7_ALT:
		{
			//status = transcode_slice(pData, data_size, slice_index, pOutput_blocks, output_blocks_buf_size_in_blocks_or_pixels, block_format::cBC7, bytes_per_block_or_pixel, decode_flags, output_row_pitch_in_blocks_or_pixels, pState);
			status = transcode_slice(pOutput_blocks, num_blocks_x, num_blocks_y, pCompressed_data + slice_offset, slice_length, block_format::cBC7,
				bytes_per_block_or_pixel, false, has_alpha, orig_width, orig_height, output_row_pitch_in_blocks_or_pixels, pState, output_rows_in_pixels);
			if (!status)
			{
				BASISU_DEVEL_ERROR("basisu_lowlevel_uastc_transcoder::transcode_image: transcode_slice() to BC7 failed\n");
			}
			break;
		}
		case transcoder_texture_format::cTFPVRTC1_4_RGB:
		{
			//status = transcode_slice(pData, data_size, slice_index, pOutput_blocks, output_blocks_buf_size_in_blocks_or_pixels, block_format::cPVRTC1_4_RGB, bytes_per_block_or_pixel, decode_flags, output_row_pitch_in_blocks_or_pixels, pState);
			status = transcode_slice(pOutput_blocks, num_blocks_x, num_blocks_y, pCompressed_data + slice_offset, slice_length, block_format::cPVRTC1_4_RGB,
				bytes_per_block_or_pixel, false, has_alpha, orig_width, orig_height, output_row_pitch_in_blocks_or_pixels, pState, output_rows_in_pixels);
			if (!status)
			{
				BASISU_DEVEL_ERROR("basisu_lowlevel_uastc_transcoder::transcode_image: transcode_slice() to PVRTC1 RGB 4bpp failed\n");
			}
			break;
		}
		case transcoder_texture_format::cTFPVRTC1_4_RGBA:
		{
			//status = transcode_slice(pData, data_size, slice_index, pOutput_blocks, output_blocks_buf_size_in_blocks_or_pixels, block_format::cPVRTC1_4_RGBA, bytes_per_block_or_pixel, decode_flags, output_row_pitch_in_blocks_or_pixels, pState);
			status = transcode_slice(pOutput_blocks, num_blocks_x, num_blocks_y, pCompressed_data + slice_offset, slice_length, block_format::cPVRTC1_4_RGBA,
				bytes_per_block_or_pixel, false, has_alpha, orig_width, orig_height, output_row_pitch_in_blocks_or_pixels, pState, output_rows_in_pixels);
			if (!status)
			{
				BASISU_DEVEL_ERROR("basisu_lowlevel_uastc_transcoder::transcode_image: transcode_slice() to PVRTC1 RGBA 4bpp failed\n");
			}
			break;
		}
		case transcoder_texture_format::cTFASTC_4x4_RGBA:
		{
			//status = transcode_slice(pData, data_size, slice_index, pOutput_blocks, output_blocks_buf_size_in_blocks_or_pixels, block_format::cASTC_4x4, bytes_per_block_or_pixel, decode_flags, output_row_pitch_in_blocks_or_pixels, pState);
			status = transcode_slice(pOutput_blocks, num_blocks_x, num_blocks_y, pCompressed_data + slice_offset, slice_length, block_format::cASTC_4x4,
				bytes_per_block_or_pixel, false, has_alpha, orig_width, orig_height, output_row_pitch_in_blocks_or_pixels, pState, output_rows_in_pixels);
			if (!status)
			{
				BASISU_DEVEL_ERROR("basisu_lowlevel_uastc_transcoder::transcode_image: transcode_slice() to ASTC 4x4 failed\n");
			}
			break;
		}
		case transcoder_texture_format::cTFATC_RGB:
		case transcoder_texture_format::cTFATC_RGBA:
		{
			BASISU_DEVEL_ERROR("basisu_lowlevel_uastc_transcoder::transcode_image: UASTC->ATC currently unsupported\n");
			return false;
		}
		case transcoder_texture_format::cTFFXT1_RGB:
		{
			BASISU_DEVEL_ERROR("basisu_lowlevel_uastc_transcoder::transcode_image: UASTC->FXT1 currently unsupported\n");
			return false;
		}
		case transcoder_texture_format::cTFPVRTC2_4_RGB:
		{
			BASISU_DEVEL_ERROR("basisu_lowlevel_uastc_transcoder::transcode_image: UASTC->PVRTC2 currently unsupported\n");
			return false;
		}
		case transcoder_texture_format::cTFPVRTC2_4_RGBA:
		{
			BASISU_DEVEL_ERROR("basisu_lowlevel_uastc_transcoder::transcode_image: UASTC->PVRTC2 currently unsupported\n");
			return false;
		}
		case transcoder_texture_format::cTFETC2_EAC_R11:
		{
			//status = transcode_slice(pData, data_size, slice_index, pOutput_blocks, output_blocks_buf_size_in_blocks_or_pixels, block_format::cETC2_EAC_R11, bytes_per_block_or_pixel, decode_flags, output_row_pitch_in_blocks_or_pixels, pState,
			//	nullptr, 0,
			//	((has_alpha) && (transcode_alpha_data_to_opaque_formats)) ? 3 : 0);
			status = transcode_slice(pOutput_blocks, num_blocks_x, num_blocks_y, pCompressed_data + slice_offset, slice_length, block_format::cETC2_EAC_R11,
				bytes_per_block_or_pixel, false, has_alpha, orig_width, orig_height, output_row_pitch_in_blocks_or_pixels, pState, output_rows_in_pixels,
				((has_alpha) && (transcode_alpha_data_to_opaque_formats)) ? 3 : 0);
			if (!status)
			{
				BASISU_DEVEL_ERROR("basisu_lowlevel_uastc_transcoder::transcode_image: transcode_slice() to EAC R11 failed\n");
			}
			break;
		}
		case transcoder_texture_format::cTFETC2_EAC_RG11:
		{
			//status = transcode_slice(pData, data_size, slice_index, pOutput_blocks, output_blocks_buf_size_in_blocks_or_pixels, block_format::cETC2_EAC_RG11, bytes_per_block_or_pixel, decode_flags, output_row_pitch_in_blocks_or_pixels, pState,
			//	nullptr, 0,
			//	0, 3);
			status = transcode_slice(pOutput_blocks, num_blocks_x, num_blocks_y, pCompressed_data + slice_offset, slice_length, block_format::cETC2_EAC_RG11,
				bytes_per_block_or_pixel, false, has_alpha, orig_width, orig_height, output_row_pitch_in_blocks_or_pixels, pState, output_rows_in_pixels,
				0, 3);
			if (!status)
			{
				BASISU_DEVEL_ERROR("basisu_basisu_lowlevel_uastc_transcodertranscoder::transcode_image: transcode_slice() to EAC RG11 failed\n");
			}
			break;
		}
		case transcoder_texture_format::cTFRGBA32:
		{
			//status = transcode_slice(pData, data_size, slice_index, pOutput_blocks, output_blocks_buf_size_in_blocks_or_pixels, block_format::cRGBA32, bytes_per_block_or_pixel, decode_flags, output_row_pitch_in_blocks_or_pixels, pState);
			status = transcode_slice(pOutput_blocks, num_blocks_x, num_blocks_y, pCompressed_data + slice_offset, slice_length, block_format::cRGBA32,
				bytes_per_block_or_pixel, false, has_alpha, orig_width, orig_height, output_row_pitch_in_blocks_or_pixels, pState, output_rows_in_pixels);
			if (!status)
			{
				BASISU_DEVEL_ERROR("basisu_lowlevel_uastc_transcoder::transcode_image: transcode_slice() to RGBA32 failed\n");
			}
			break;
		}
		case transcoder_texture_format::cTFRGB565:
		{
			//status = transcode_slice(pData, data_size, slice_index, pOutput_blocks, output_blocks_buf_size_in_blocks_or_pixels, block_format::cRGB565, bytes_per_block_or_pixel, decode_flags, output_row_pitch_in_blocks_or_pixels, pState);
			status = transcode_slice(pOutput_blocks, num_blocks_x, num_blocks_y, pCompressed_data + slice_offset, slice_length, block_format::cRGB565,
				bytes_per_block_or_pixel, false, has_alpha, orig_width, orig_height, output_row_pitch_in_blocks_or_pixels, pState, output_rows_in_pixels);
			if (!status)
			{
				BASISU_DEVEL_ERROR("basisu_lowlevel_uastc_transcoder::transcode_image: transcode_slice() to RGB565 failed\n");
			}
			break;
		}
		case transcoder_texture_format::cTFBGR565:
		{
			//status = transcode_slice(pData, data_size, slice_index, pOutput_blocks, output_blocks_buf_size_in_blocks_or_pixels, block_format::cBGR565, bytes_per_block_or_pixel, decode_flags, output_row_pitch_in_blocks_or_pixels, pState);
			status = transcode_slice(pOutput_blocks, num_blocks_x, num_blocks_y, pCompressed_data + slice_offset, slice_length, block_format::cBGR565,
				bytes_per_block_or_pixel, false, has_alpha, orig_width, orig_height, output_row_pitch_in_blocks_or_pixels, pState, output_rows_in_pixels);
			if (!status)
			{
				BASISU_DEVEL_ERROR("basisu_lowlevel_uastc_transcoder::transcode_image: transcode_slice() to RGB565 failed\n");
			}
			break;
		}
		case transcoder_texture_format::cTFRGBA4444:
		{
			//status = transcode_slice(pData, data_size, slice_index, pOutput_blocks, output_blocks_buf_size_in_blocks_or_pixels, block_format::cRGBA4444, bytes_per_block_or_pixel, decode_flags, output_row_pitch_in_blocks_or_pixels, pState);
			status = transcode_slice(pOutput_blocks, num_blocks_x, num_blocks_y, pCompressed_data + slice_offset, slice_length, block_format::cRGBA4444,
				bytes_per_block_or_pixel, false, has_alpha, orig_width, orig_height, output_row_pitch_in_blocks_or_pixels, pState, output_rows_in_pixels);
			if (!status)
			{
				BASISU_DEVEL_ERROR("basisu_lowlevel_uastc_transcoder::transcode_image: transcode_slice() to RGBA4444 failed\n");
			}
			break;
		}
		default:
		{
			assert(0);
			BASISU_DEVEL_ERROR("basisu_lowlevel_uastc_transcoder::transcode_image: Invalid format\n");
			break;
		}
		}

		return status;
	}